

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O3

void __thiscall
QXmlStreamReader::addExtraNamespaceDeclaration
          (QXmlStreamReader *this,QXmlStreamNamespaceDeclaration *extraNamespaceDeclaration)

{
  undefined8 *puVar1;
  _Head_base<0UL,_QXmlStreamReaderPrivate_*,_false> this_00;
  long lVar2;
  void *__ptr;
  long lVar3;
  long lVar4;
  long in_FS_OFFSET;
  QAnyStringView s;
  QAnyStringView s_00;
  XmlStringRef local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00._M_head_impl =
       (this->d_ptr)._M_t.
       super___uniq_ptr_impl<QXmlStreamReaderPrivate,_std::default_delete<QXmlStreamReaderPrivate>_>
       ._M_t.
       super__Tuple_impl<0UL,_QXmlStreamReaderPrivate_*,_std::default_delete<QXmlStreamReaderPrivate>_>
       .super__Head_base<0UL,_QXmlStreamReaderPrivate_*,_false>._M_head_impl;
  __ptr = *(void **)&(this_00._M_head_impl)->super_QXmlStreamPrivateTagStack;
  lVar4 = *(qsizetype *)((long)&(this_00._M_head_impl)->super_QXmlStreamPrivateTagStack + 8);
  lVar3 = lVar4 + 1;
  lVar2 = *(qsizetype *)((long)&(this_00._M_head_impl)->super_QXmlStreamPrivateTagStack + 0x10);
  if (lVar2 <= lVar3) {
    lVar4 = lVar4 + 2;
    lVar3 = lVar2 * 2;
    if (lVar4 != lVar3 && SBORROW8(lVar4,lVar3) == lVar4 + lVar2 * -2 < 0) {
      lVar3 = lVar4;
    }
    *(long *)((long)&(this_00._M_head_impl)->super_QXmlStreamPrivateTagStack + 0x10) = lVar3;
    __ptr = realloc(__ptr,lVar3 * 0x30);
    *(void **)&(this_00._M_head_impl)->super_QXmlStreamPrivateTagStack = __ptr;
    if (__ptr == (void *)0x0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        qBadAlloc();
      }
      goto LAB_00396955;
    }
    lVar3 = *(qsizetype *)((long)&(this_00._M_head_impl)->super_QXmlStreamPrivateTagStack + 8) + 1;
  }
  *(long *)((long)&(this_00._M_head_impl)->super_QXmlStreamPrivateTagStack + 8) = lVar3;
  lVar3 = lVar3 * 0x30;
  puVar1 = (undefined8 *)((long)__ptr + lVar3 + 0x20);
  *puVar1 = 0;
  puVar1[1] = 0;
  puVar1 = (undefined8 *)((long)__ptr + lVar3 + 0x10);
  *puVar1 = 0;
  puVar1[1] = 0;
  *(undefined8 *)((long)__ptr + lVar3) = 0;
  ((undefined8 *)((long)__ptr + lVar3))[1] = 0;
  s.m_size = (extraNamespaceDeclaration->m_prefix).m_string.size | 0x8000000000000000;
  s.field_0.m_data_utf16 = (extraNamespaceDeclaration->m_prefix).m_string.ptr;
  QXmlStreamPrivateTagStack::addToStringStorage
            (&local_50,&(this_00._M_head_impl)->super_QXmlStreamPrivateTagStack,s);
  *(qsizetype *)((long)__ptr + lVar3 + 0x10) = local_50.m_size;
  *(undefined8 *)((long)__ptr + lVar3) = local_50.m_string;
  ((undefined8 *)((long)__ptr + lVar3))[1] = local_50.m_pos;
  s_00.m_size = (extraNamespaceDeclaration->m_namespaceUri).m_string.size | 0x8000000000000000;
  s_00.field_0.m_data_utf16 = (extraNamespaceDeclaration->m_namespaceUri).m_string.ptr;
  QXmlStreamPrivateTagStack::addToStringStorage
            (&local_50,&(this_00._M_head_impl)->super_QXmlStreamPrivateTagStack,s_00);
  *(qsizetype *)((long)__ptr + lVar3 + 0x28) = local_50.m_size;
  puVar1 = (undefined8 *)((long)__ptr + lVar3 + 0x18);
  *puVar1 = local_50.m_string;
  puVar1[1] = local_50.m_pos;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_00396955:
  __stack_chk_fail();
}

Assistant:

void QXmlStreamReader::addExtraNamespaceDeclaration(const QXmlStreamNamespaceDeclaration &extraNamespaceDeclaration)
{
    Q_D(QXmlStreamReader);
    QXmlStreamReaderPrivate::NamespaceDeclaration &namespaceDeclaration = d->namespaceDeclarations.push();
    namespaceDeclaration.prefix = d->addToStringStorage(extraNamespaceDeclaration.prefix());
    namespaceDeclaration.namespaceUri = d->addToStringStorage(extraNamespaceDeclaration.namespaceUri());
}